

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O2

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[1]);
  dVar3 = sin(j[2]);
  dVar4 = cos(j[2]);
  dVar5 = sin(j[1]);
  dVar6 = sin(j[3]);
  dVar7 = cos(j[3]);
  dVar8 = sin(*j);
  dVar9 = sin(j[4]);
  dVar10 = cos(j[4]);
  dVar11 = sin(j[5]);
  dVar12 = cos(j[5]);
  dVar20 = dVar2 * dVar4;
  dVar13 = dVar2 * dVar3;
  dVar3 = dVar3 * dVar5;
  dVar21 = dVar1 * dVar20 - dVar3 * dVar1;
  dVar4 = dVar4 * dVar5;
  dVar24 = dVar1 * 0.08;
  dVar25 = dVar20 * dVar8 - dVar3 * dVar8;
  dVar22 = dVar8 * 0.08;
  dVar14 = dVar3 - dVar20;
  dVar15 = dVar14 * dVar7 * dVar10;
  dVar23 = -dVar13 + dVar4 * -1.0;
  dVar17 = dVar23 * dVar1;
  dVar18 = dVar17 * dVar6 + dVar8 * dVar7;
  dVar16 = dVar21 * dVar9;
  dVar19 = (dVar8 * dVar6 - dVar7 * dVar17) * dVar10;
  *eerot = dVar9 * (dVar8 * dVar6 * -1.0 + dVar17 * dVar7) + dVar21 * dVar10;
  eerot[1] = dVar12 * dVar18 + (-dVar16 - dVar19) * dVar11;
  eerot[2] = (dVar19 + dVar16) * dVar12 + dVar18 * dVar11;
  *eetrans = (dVar24 * dVar20 - dVar3 * dVar24) * dVar10 +
             dVar1 * 0.365 * dVar20 +
             (dVar17 * dVar7 * 0.08 - dVar22 * dVar6) * dVar9 +
             ((dVar1 * 0.035 * dVar4 +
              dVar1 * 0.035 * dVar13 + dVar1 * 0.025 + dVar1 * dVar2 * 0.315) -
             dVar1 * 0.365 * dVar3);
  dVar16 = dVar23 * dVar8;
  dVar17 = dVar16 * -dVar7 + -dVar1 * dVar6;
  dVar18 = dVar6 * dVar16 * -1.0 + dVar7 * dVar1;
  eerot[3] = (-dVar8 * dVar20 + dVar3 * dVar8) * dVar10 + dVar9 * dVar17;
  eerot[4] = (dVar17 * dVar10 + dVar25 * dVar9) * dVar11 + dVar12 * dVar18;
  eerot[5] = dVar18 * dVar11 +
             (dVar25 * -dVar9 - (-dVar1 * dVar6 - dVar7 * dVar16) * dVar10) * dVar12;
  eetrans[1] = ((dVar8 * 0.365 * dVar3 +
                dVar8 * -0.025 +
                (((-dVar24 * dVar6 - dVar16 * dVar7 * 0.08) * dVar9 +
                 ((dVar22 * dVar3 - dVar20 * dVar22) * dVar10 - dVar20 * dVar8 * 0.365)) -
                dVar2 * 0.315 * dVar8)) - dVar4 * dVar8 * 0.035) - dVar8 * 0.035 * dVar13;
  eerot[6] = dVar14 * dVar9 * dVar7 + dVar23 * dVar10;
  eerot[7] = dVar12 * dVar6 * dVar14 + (dVar15 + dVar9 * (dVar13 + dVar4)) * dVar11;
  eerot[8] = ((dVar13 + dVar4) * -dVar9 - dVar15) * dVar12 + dVar6 * dVar14 * dVar11;
  eetrans[2] = dVar5 * -0.315 +
               dVar20 * 0.035 +
               (dVar20 * -0.08 + dVar3 * 0.08) * dVar9 * dVar7 +
               (dVar13 * -0.08 + dVar4 * -0.08) * dVar10 +
               dVar3 * -0.035 + dVar13 * -0.365 + dVar4 * -0.365 + 0.4;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((1.0)*x6);
x13=((0.035)*x7);
x14=((0.365)*x7);
x15=((1.0)*x7);
x16=((0.035)*x0);
x17=((1.0)*x0);
x18=((0.315)*x1);
x19=((0.08)*x0);
x20=((0.365)*x0);
x21=((0.08)*x7);
x22=((0.08)*x6);
x23=(x3*x4);
x24=(x0*x5);
x25=(x1*x3);
x26=((-1.0)*x9);
x27=((-1.0)*x8);
x28=(x2*x4);
x29=(x1*x2);
x30=(x6*x8);
x31=(x15*x5);
x32=(x0*x12);
x33=(x15*x28);
x34=((((-1.0)*x25))+x28);
x35=(x23+x29);
x36=(x34*x5);
x37=(x34*x6);
x38=(((x0*x25))+(((-1.0)*x17*x28)));
x39=((((-1.0)*x33))+((x25*x7)));
x40=(x37*x9);
x41=(x17*(((((-1.0)*x23))+(((-1.0)*x29)))));
x42=(x15*(((((-1.0)*x23))+(((-1.0)*x29)))));
x43=(x38*x8);
x44=(x42*x5);
x45=(x42*x6);
x46=((-1.0)*x42);
x47=(((x41*x5))+((x6*x7)));
x48=((((-1.0)*x12*x41))+x31);
x49=((((-1.0)*x12*x42))+(((-1.0)*x17*x5)));
x50=(x48*x9);
eerot[0]=(((x8*(((((-1.0)*x31))+((x41*x6))))))+((x38*x9)));
eerot[1]=(((x11*x47))+((x10*(((((-1.0)*x43))+(((-1.0)*x50)))))));
eerot[2]=(((x11*((x43+x50))))+((x10*x47)));
IkReal x51=((1.0)*x28);
eetrans[0]=((((0.025)*x0))+((x0*x18))+((x16*x29))+((x16*x23))+(((-1.0)*x20*x51))+((x8*(((((-1.0)*x21*x5))+((x22*x41))))))+((x20*x25))+((x9*((((x19*x25))+(((-1.0)*x19*x51)))))));
eerot[3]=(((x9*(((((-1.0)*x15*x25))+x33))))+((x49*x8)));
eerot[4]=(((x10*((((x49*x9))+((x39*x8))))))+((x11*(((((-1.0)*x44))+x32)))));
eerot[5]=(((x10*(((((-1.0)*x44))+x32))))+((x11*((((x27*x39))+((x26*(((((-1.0)*x45))+(((-1.0)*x24)))))))))));
IkReal x52=((1.0)*x13);
IkReal x53=((1.0)*x25);
eetrans[1]=(((x9*((((x21*x28))+(((-1.0)*x21*x53))))))+(((-1.0)*x14*x53))+((x8*(((((-1.0)*x19*x5))+(((-1.0)*x22*x42))))))+(((-1.0)*x18*x7))+(((-0.025)*x7))+((x14*x28))+(((-1.0)*x23*x52))+(((-1.0)*x29*x52)));
eerot[6]=(((x30*x34))+((x9*(((((-1.0)*x23))+(((-1.0)*x29)))))));
eerot[7]=(((x11*x36))+((x10*((((x35*x8))+x40)))));
eerot[8]=(((x11*((((x27*x35))+((x26*x37))))))+((x10*x36)));
eetrans[2]=((0.4)+(((-0.365)*x23))+(((-0.365)*x29))+(((-0.035)*x28))+((x9*(((((-0.08)*x29))+(((-0.08)*x23))))))+((x30*(((((-0.08)*x25))+(((0.08)*x28))))))+(((0.035)*x25))+(((-0.315)*x4)));
}